

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codeholder.cpp
# Opt level: O0

void asmjit::CodeHolder_resetInternal(CodeHolder *self,bool releaseMemory)

{
  byte bVar1;
  byte in_SIL;
  undefined4 *in_RDI;
  ZoneHeap *heap;
  SectionEntry *section;
  size_t i;
  size_t numSections;
  char *in_stack_00000360;
  int in_stack_0000036c;
  char *in_stack_00000370;
  ZoneHeap *in_stack_ffffffffffffff78;
  CodeEmitter *in_stack_ffffffffffffff80;
  ZoneHeap *this;
  CodeHolder *in_stack_ffffffffffffff88;
  ZoneHeap *this_00;
  undefined7 in_stack_ffffffffffffff90;
  
  bVar1 = in_SIL & 1;
  while (*(long *)(in_RDI + 6) != 0) {
    CodeHolder::detach(in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
  }
  *in_RDI = 0;
  *(undefined1 *)(in_RDI + 1) = 0;
  *(undefined1 *)((long)in_RDI + 5) = 0;
  *(undefined1 *)((long)in_RDI + 6) = 0;
  *(undefined1 *)((long)in_RDI + 7) = 0;
  *(undefined8 *)(in_RDI + 2) = 0xffffffffffffffff;
  in_RDI[4] = 0;
  in_RDI[5] = 0;
  *(undefined8 *)(in_RDI + 10) = 0;
  *(undefined8 *)(in_RDI + 0xc) = 0;
  in_RDI[0xe] = 0;
  in_RDI[0xf] = 0;
  this_00 = *(ZoneHeap **)(in_RDI + 0x3a);
  this = (ZoneHeap *)0x0;
  while( true ) {
    if (this_00 <= this) {
      ZoneHashBase::reset((ZoneHashBase *)this,in_stack_ffffffffffffff78);
      *(undefined8 *)(in_RDI + 0x44) = 0;
      *(undefined8 *)(in_RDI + 0x46) = 0;
      *(undefined8 *)(in_RDI + 0x48) = 0;
      *(undefined8 *)(in_RDI + 0x3e) = 0;
      *(undefined8 *)(in_RDI + 0x40) = 0;
      *(undefined8 *)(in_RDI + 0x42) = 0;
      *(undefined8 *)(in_RDI + 0x38) = 0;
      *(undefined8 *)(in_RDI + 0x3a) = 0;
      *(undefined8 *)(in_RDI + 0x3c) = 0;
      ZoneHeap::reset(this_00,(Zone *)this);
      Zone::reset((Zone *)CONCAT17(bVar1,in_stack_ffffffffffffff90),SUB81((ulong)this_00 >> 0x38,0))
      ;
      return;
    }
    if (*(ZoneHeap **)(in_RDI + 0x3a) <= this) break;
    in_stack_ffffffffffffff78 = *(ZoneHeap **)(*(long *)(in_RDI + 0x38) + (long)this * 8);
    if ((in_stack_ffffffffffffff78->_slots[6] != (Slot *)0x0) &&
       (((ulong)in_stack_ffffffffffffff78->_slots[9] & 1) == 0)) {
      free(in_stack_ffffffffffffff78->_slots[6]);
    }
    in_stack_ffffffffffffff78->_slots[6] = (Slot *)0x0;
    in_stack_ffffffffffffff78->_slots[8] = (Slot *)0x0;
    this = (ZoneHeap *)((long)&this->_zone + 1);
  }
  DebugUtils::assertionFailed(in_stack_00000370,in_stack_0000036c,in_stack_00000360);
}

Assistant:

static void CodeHolder_resetInternal(CodeHolder* self, bool releaseMemory) noexcept {
  // Detach all `CodeEmitter`s.
  while (self->_emitters)
    self->detach(self->_emitters);

  // Reset everything into its construction state.
  self->_codeInfo.reset();
  self->_globalHints = 0;
  self->_globalOptions = 0;
  self->_logger = nullptr;
  self->_errorHandler = nullptr;

  self->_unresolvedLabelsCount = 0;
  self->_trampolinesSize = 0;

  // Reset all sections.
  size_t numSections = self->_sections.getLength();
  for (size_t i = 0; i < numSections; i++) {
    SectionEntry* section = self->_sections[i];
    if (section->_buffer.hasData() && !section->_buffer.isExternal())
      Internal::releaseMemory(section->_buffer._data);
    section->_buffer._data = nullptr;
    section->_buffer._capacity = 0;
  }

  // Reset zone allocator and all containers using it.
  ZoneHeap* heap = &self->_baseHeap;

  self->_namedLabels.reset(heap);
  self->_relocations.reset();
  self->_labels.reset();
  self->_sections.reset();

  heap->reset(&self->_baseZone);
  self->_baseZone.reset(releaseMemory);
}